

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_ignored_stdio(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  int extraout_EDX;
  uv_process_options_t *loop;
  uv__queue **ppuVar3;
  uv_handle_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 *puStack_60;
  uv_loop_t *puStack_58;
  undefined8 uStack_50;
  uv__queue *puStack_40;
  uv__queue *puStack_38;
  code *pcStack_30;
  uv__queue *local_20;
  uv__queue *local_18;
  
  pcStack_30 = (code *)0x1bd02b;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  loop = &options;
  options.stdio_count = 0;
  pcStack_30 = (code *)0x1bd04b;
  puVar2 = uv_default_loop();
  pcStack_30 = (code *)0x1bd05d;
  iVar1 = uv_spawn(puVar2,&process,&options);
  local_18 = (uv__queue *)(long)iVar1;
  local_20 = (uv__queue *)0x0;
  if (local_18 == (uv__queue *)0x0) {
    pcStack_30 = (code *)0x1bd07e;
    puVar2 = uv_default_loop();
    pcStack_30 = (code *)0x1bd088;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_18 = (uv__queue *)(long)iVar1;
    local_20 = (uv__queue *)0x0;
    if (local_18 != (uv__queue *)0x0) goto LAB_001bd15c;
    local_18 = (uv__queue *)0x1;
    local_20 = (uv__queue *)(long)exit_cb_called;
    if (local_20 != (uv__queue *)0x1) goto LAB_001bd16b;
    local_18 = (uv__queue *)0x1;
    local_20 = (uv__queue *)(long)close_cb_called;
    if (local_20 != (uv__queue *)0x1) goto LAB_001bd17a;
    pcStack_30 = (code *)0x1bd0f7;
    loop = (uv_process_options_t *)uv_default_loop();
    pcStack_30 = (code *)0x1bd10b;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    pcStack_30 = (code *)0x1bd115;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    local_18 = (uv__queue *)0x0;
    pcStack_30 = (code *)0x1bd123;
    puVar2 = uv_default_loop();
    pcStack_30 = (code *)0x1bd12b;
    iVar1 = uv_loop_close(puVar2);
    local_20 = (uv__queue *)(long)iVar1;
    if (local_18 == local_20) {
      pcStack_30 = (code *)0x1bd143;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x1bd15c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001bd15c:
    pcStack_30 = (code *)0x1bd16b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001bd16b:
    pcStack_30 = (code *)0x1bd17a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001bd17a:
    pcStack_30 = (code *)0x1bd189;
    run_test_spawn_ignored_stdio_cold_4();
  }
  pcStack_30 = run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  ppuVar3 = &puStack_40;
  pcStack_30 = (code *)loop;
  init_process_options("spawn_helper4",kill_cb);
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  puStack_38 = (uv__queue *)(long)iVar1;
  puStack_40 = (uv__queue *)0x0;
  if (puStack_38 == (uv__queue *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    puStack_38 = (uv__queue *)(long)iVar1;
    puStack_40 = (uv__queue *)0x0;
    if (puStack_38 != (uv__queue *)0x0) goto LAB_001bd32a;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    puStack_38 = (uv__queue *)(long)iVar1;
    puStack_40 = (uv__queue *)0x0;
    if (puStack_38 != (uv__queue *)0x0) goto LAB_001bd337;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_38 = (uv__queue *)(long)iVar1;
    puStack_40 = (uv__queue *)0x0;
    if (puStack_38 != (uv__queue *)0x0) goto LAB_001bd344;
    puStack_38 = (uv__queue *)0x1;
    puStack_40 = (uv__queue *)(long)exit_cb_called;
    if (puStack_40 != (uv__queue *)0x1) goto LAB_001bd351;
    puStack_38 = (uv__queue *)0x2;
    puStack_40 = (uv__queue *)(long)close_cb_called;
    if (puStack_40 != (uv__queue *)0x2) goto LAB_001bd35e;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_38 = (uv__queue *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    puStack_40 = (uv__queue *)(long)iVar1;
    if (puStack_38 == puStack_40) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
LAB_001bd32a:
    run_test_spawn_and_kill_cold_2();
LAB_001bd337:
    run_test_spawn_and_kill_cold_3();
LAB_001bd344:
    run_test_spawn_and_kill_cold_4();
LAB_001bd351:
    run_test_spawn_and_kill_cold_5();
LAB_001bd35e:
    run_test_spawn_and_kill_cold_6();
  }
  puVar4 = (uv_handle_t *)&stack0xffffffffffffffc8;
  run_test_spawn_and_kill_cold_7();
  uStack_50._0_4_ = UV_UNKNOWN_HANDLE;
  uStack_50._4_4_ = 0;
  puStack_58 = (uv_loop_t *)loop;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  puStack_60 = (undefined1 *)ppuVar3;
  if (ppuVar3 == (uv__queue **)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001bd419;
    uv_close(puVar4,close_cb);
    puStack_60 = (undefined1 *)(long)*(int *)&puVar4[1].loop;
    if (puStack_60 != (undefined1 *)0x0) {
      iVar1 = uv_kill(*(int *)&puVar4[1].loop,0);
      puStack_60 = (undefined1 *)(long)iVar1;
      if (puStack_60 == (undefined1 *)0xfffffffffffffffd) {
        return iVar1;
      }
      goto LAB_001bd42b;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001bd419:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001bd42b:
  puVar4 = (uv_handle_t *)&puStack_60;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(puVar4,close_cb);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_ignored_stdio) {
  int r;

  init_process_options("spawn_helper6", exit_cb);

  options.stdio = NULL;
  options.stdio_count = 0;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}